

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr,REF_ADJ original)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uStack_30;
  
  pRVar2 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar2;
  if (pRVar2 == (REF_ADJ)0x0) {
    pcVar7 = "malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL";
    uStack_30 = 0x3f;
  }
  else {
    lVar8 = (long)original->nnode;
    pRVar2->nnode = original->nnode;
    uVar1 = original->nitem;
    pRVar2->nitem = uVar1;
    if (lVar8 < 0) {
      pcVar7 = "malloc ref_adj->first of REF_INT negative";
      uStack_30 = 0x45;
LAB_0010ec73:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",
             uStack_30,"ref_adj_deep_copy",pcVar7);
      return 1;
    }
    pRVar3 = (REF_INT *)malloc(lVar8 * 4);
    pRVar2->first = pRVar3;
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar7 = "malloc ref_adj->first of REF_INT NULL";
      uStack_30 = 0x45;
    }
    else {
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        pRVar3[lVar5] = original->first[lVar5];
      }
      if ((int)uVar1 < 0) {
        pcVar7 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT negative";
        uStack_30 = 0x49;
        goto LAB_0010ec73;
      }
      pRVar4 = (REF_ADJ_ITEM)malloc((ulong)uVar1 * 8);
      pRVar2->item = pRVar4;
      if (pRVar4 != (REF_ADJ_ITEM)0x0) {
        for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
          pRVar4[uVar6] = original->item[uVar6];
        }
        pRVar2->blank = original->blank;
        return 0;
      }
      pcVar7 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL";
      uStack_30 = 0x49;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uStack_30,
         "ref_adj_deep_copy",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr, REF_ADJ original) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = ref_adj_nnode(original);
  ref_adj_nitem(ref_adj) = ref_adj_nitem(original);

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++)
    ref_adj->first[i] = original->first[i];

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = original->item[i].ref;
    ref_adj->item[i].next = original->item[i].next;
  }
  ref_adj->blank = original->blank;

  return REF_SUCCESS;
}